

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNormalizer::error(DOMNormalizer *this,Codes code,DOMNode *node)

{
  byte bVar1;
  ErrorSeverity severity;
  Codes *pCVar2;
  undefined1 local_1058 [7];
  bool toContinueProcess;
  DOMErrorImpl domError;
  XMLCh errText [2048];
  XMLSize_t maxChars;
  DOMNode *node_local;
  Codes code_local;
  DOMNormalizer *this_local;
  
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    (**(code **)(*gMsgLoader + 0x10))(gMsgLoader,code,&domError.fRelatedData,0x7ff);
    severity = XMLErrs::DOMErrorType(code);
    DOMErrorImpl::DOMErrorImpl
              ((DOMErrorImpl *)local_1058,severity,(XMLCh *)0x0,(XMLCh *)&domError.fRelatedData,node
              );
    bVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))
                      (this->fErrorHandler,(DOMErrorImpl *)local_1058);
    if ((bVar1 & 1) == 0) {
      pCVar2 = (Codes *)__cxa_allocate_exception(4);
      *pCVar2 = code;
      __cxa_throw(pCVar2,&XMLErrs::Codes::typeinfo,0);
    }
    DOMErrorImpl::~DOMErrorImpl((DOMErrorImpl *)local_1058);
  }
  return;
}

Assistant:

void DOMNormalizer::error(const XMLErrs::Codes code, const DOMNode *node) const
{
    if (fErrorHandler) {

        //  Load the message into alocal and replace any tokens found in
        //  the text.
        const XMLSize_t maxChars = 2047;
        XMLCh errText[maxChars + 1];

        if (!gMsgLoader->loadMsg(code, errText, maxChars))
        {
                // <TBD> Should probably load a default message here
        }

        DOMErrorImpl domError(
          XMLErrs::DOMErrorType (code), 0, errText, (void*)node);
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess)
            throw (XMLErrs::Codes) code;
    }
}